

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O0

VmValue * CompileVmVariableAccess(ExpressionContext *ctx,VmModule *module,ExprVariableAccess *node)

{
  SynBase *source;
  VariableData *variable;
  SynIdentifier *pSVar1;
  bool bVar2;
  TypeRef *structType;
  VmValue *pVVar3;
  VmValue *value;
  VmValue *address;
  ExprVariableAccess *node_local;
  VmModule *module_local;
  ExpressionContext *ctx_local;
  
  bVar2 = isType<TypeVoid>(node->variable->type);
  if (bVar2) {
    pVVar3 = anon_unknown.dwarf_aa461::CreateVoid(module);
    ctx_local = (ExpressionContext *)
                anon_unknown.dwarf_aa461::CheckType(ctx,&node->super_ExprBase,pVVar3);
  }
  else {
    source = (node->super_ExprBase).source;
    variable = node->variable;
    structType = ExpressionContext::GetReferenceType(ctx,node->variable->type);
    pVVar3 = anon_unknown.dwarf_aa461::CreateVariableAddress
                       (module,source,variable,&structType->super_TypeBase);
    pVVar3 = anon_unknown.dwarf_aa461::CreateLoad
                       (ctx,module,(node->super_ExprBase).source,node->variable->type,pVVar3,0);
    pSVar1 = node->variable->name;
    (pVVar3->comment).begin = (pSVar1->name).begin;
    (pVVar3->comment).end = (pSVar1->name).end;
    ctx_local = (ExpressionContext *)
                anon_unknown.dwarf_aa461::CheckType(ctx,&node->super_ExprBase,pVVar3);
  }
  return (VmValue *)ctx_local;
}

Assistant:

VmValue* CompileVmVariableAccess(ExpressionContext &ctx, VmModule *module, ExprVariableAccess *node)
{
	if(isType<TypeVoid>(node->variable->type))
		return CheckType(ctx, node, CreateVoid(module));

	VmValue *address = CreateVariableAddress(module, node->source, node->variable, ctx.GetReferenceType(node->variable->type));

	VmValue *value = CreateLoad(ctx, module, node->source, node->variable->type, address, 0);

	value->comment = node->variable->name->name;

	return CheckType(ctx, node, value);
}